

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall QGraphicsView::~QGraphicsView(QGraphicsView *this)

{
  long lVar1;
  bool bVar2;
  QGraphicsViewPrivate *pQVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QGraphicsViewPrivate *d;
  QGraphicsView **in_stack_ffffffffffffffc8;
  QList<QGraphicsView_*> *in_stack_ffffffffffffffd0;
  QAbstractScrollArea *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = &PTR_metaObject_00d356c0;
  in_RDI[2] = &PTR__QGraphicsView_00d358b0;
  pQVar3 = d_func((QGraphicsView *)0xa37b39);
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa37b4f);
  if (bVar2) {
    QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa37b66);
    QGraphicsScene::d_func((QGraphicsScene *)0xa37b6e);
    QList<QGraphicsView*>::removeAll<QGraphicsView*>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  this_00 = (QAbstractScrollArea *)pQVar3->lastDragDropEvent;
  if (this_00 != (QAbstractScrollArea *)0x0) {
    (**(code **)(*(long *)&(this_00->super_QFrame).super_QWidget + 8))();
  }
  QAbstractScrollArea::~QAbstractScrollArea(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QGraphicsView::~QGraphicsView()
{
    Q_D(QGraphicsView);
    if (d->scene)
        d->scene->d_func()->views.removeAll(this);
    delete d->lastDragDropEvent;
}